

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

QMargins __thiscall QLineEditPrivate::effectiveTextMargins(QLineEditPrivate *this)

{
  int iVar1;
  int iVar2;
  SideWidgetEntryList *pSVar3;
  long in_FS_OFFSET;
  QMargins QVar4;
  SideWidgetParameters local_50;
  SideWidgetParameters local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (this->textMargins).m_left.m_i;
  pSVar3 = leftSideWidgetList(this);
  local_40 = sideWidgetParameters(this);
  QVar4.m_left.m_i = effectiveTextMargin(iVar1,pSVar3,&local_40);
  iVar1 = (this->textMargins).m_top.m_i;
  iVar2 = (this->textMargins).m_right.m_i;
  pSVar3 = rightSideWidgetList(this);
  local_50 = sideWidgetParameters(this);
  iVar2 = effectiveTextMargin(iVar2,pSVar3,&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar4.m_top.m_i = iVar1;
    QVar4.m_bottom.m_i = (this->textMargins).m_bottom.m_i;
    QVar4.m_right.m_i = iVar2;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QMargins QLineEditPrivate::effectiveTextMargins() const
{
    return {effectiveTextMargin(textMargins.left(), leftSideWidgetList(), sideWidgetParameters()),
            textMargins.top(),
            effectiveTextMargin(textMargins.right(), rightSideWidgetList(), sideWidgetParameters()),
            textMargins.bottom()};
}